

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O2

void __thiscall psy::C::ReparserTester::case0008(ReparserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1da;
  allocator<char> local_1d9;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d8;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1c0;
  string local_1a8;
  SyntaxKind local_188 [8];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"\nint _ ( )\n{\n    int x ;\n    x * y ;\n}\n",&local_1d9);
  Expectation::Expectation(&local_178);
  local_188[0] = DeclarationStatement;
  local_188[1] = VariableAndOrFunctionDeclaration;
  local_188[2] = BasicTypeSpecifier;
  local_188[3] = IdentifierDeclarator;
  local_188[4] = ExpressionStatement;
  local_188[5] = MultiplyExpression;
  local_188[6] = IdentifierName;
  local_188[7] = IdentifierName;
  __l._M_len = 8;
  __l._M_array = local_188;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1d8,__l,
             &local_1da);
  preamble_clean((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1c0,
                 (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1d8);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1c0);
  Expectation::Expectation(&local_c0,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_1a8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1d8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void ReparserTester::case0008()
{
    auto s = R"(
int _ ( )
{
    int x ;
    x * y ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_clean(
                        { SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::BasicTypeSpecifier,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::ExpressionStatement,
                          SyntaxKind::MultiplyExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName })));
}